

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexgenerator.cpp
# Opt level: O0

size_t meshopt_generateVertexRemap
                 (uint *destination,uint *indices,size_t index_count,void *vertices,
                 size_t vertex_count,size_t vertex_size)

{
  meshopt_Allocator *this;
  uint *empty;
  meshopt_Allocator *pmVar1;
  ulong in_RDX;
  long in_RSI;
  void *in_RDI;
  size_t in_R8;
  uint *entry;
  uint index;
  size_t i;
  uint next_vertex;
  uint *table;
  size_t table_size;
  VertexHasher hasher;
  meshopt_Allocator allocator;
  meshopt_Allocator *in_stack_fffffffffffffe80;
  undefined4 local_16c;
  size_t in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea8;
  uint *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined8 local_140;
  undefined4 local_134;
  
  meshopt_Allocator::meshopt_Allocator(in_stack_fffffffffffffe80);
  memset(in_RDI,0xff,in_R8 << 2);
  this = (meshopt_Allocator *)meshopt::hashBuckets(in_R8);
  pmVar1 = this;
  empty = meshopt_Allocator::allocate<unsigned_int>(this,in_stack_fffffffffffffe98);
  memset(empty,0xff,(long)this << 2);
  local_134 = 0;
  for (local_140 = 0; local_140 < in_RDX; local_140 = local_140 + 1) {
    if (in_RSI == 0) {
      local_16c = (uint)local_140;
    }
    else {
      local_16c = *(uint *)(in_RSI + local_140 * 4);
    }
    if (*(int *)((long)in_RDI + (ulong)local_16c * 4) == -1) {
      in_stack_fffffffffffffeb0 =
           meshopt::hashLookup<unsigned_int,meshopt::VertexHasher>
                     ((uint *)CONCAT44(local_16c,in_stack_fffffffffffffeb8),
                      (size_t)in_stack_fffffffffffffeb0,
                      (VertexHasher *)CONCAT44(0xffffffff,in_stack_fffffffffffffea8),(uint *)pmVar1,
                      empty);
      if (*in_stack_fffffffffffffeb0 == 0xffffffff) {
        *in_stack_fffffffffffffeb0 = local_16c;
        *(uint *)((long)in_RDI + (ulong)local_16c * 4) = local_134;
        local_134 = local_134 + 1;
      }
      else {
        *(undefined4 *)((long)in_RDI + (ulong)local_16c * 4) =
             *(undefined4 *)((long)in_RDI + (ulong)*in_stack_fffffffffffffeb0 * 4);
      }
    }
  }
  pmVar1 = (meshopt_Allocator *)(ulong)local_134;
  meshopt_Allocator::~meshopt_Allocator(pmVar1);
  return (size_t)pmVar1;
}

Assistant:

size_t meshopt_generateVertexRemap(unsigned int* destination, const unsigned int* indices, size_t index_count, const void* vertices, size_t vertex_count, size_t vertex_size)
{
	using namespace meshopt;

	assert(indices || index_count == vertex_count);
	assert(index_count % 3 == 0);
	assert(vertex_size > 0 && vertex_size <= 256);

	meshopt_Allocator allocator;

	memset(destination, -1, vertex_count * sizeof(unsigned int));

	VertexHasher hasher = {static_cast<const unsigned char*>(vertices), vertex_size, vertex_size};

	size_t table_size = hashBuckets(vertex_count);
	unsigned int* table = allocator.allocate<unsigned int>(table_size);
	memset(table, -1, table_size * sizeof(unsigned int));

	unsigned int next_vertex = 0;

	for (size_t i = 0; i < index_count; ++i)
	{
		unsigned int index = indices ? indices[i] : unsigned(i);
		assert(index < vertex_count);

		if (destination[index] == ~0u)
		{
			unsigned int* entry = hashLookup(table, table_size, hasher, index, ~0u);

			if (*entry == ~0u)
			{
				*entry = index;

				destination[index] = next_vertex++;
			}
			else
			{
				assert(destination[*entry] != ~0u);

				destination[index] = destination[*entry];
			}
		}
	}

	assert(next_vertex <= vertex_count);

	return next_vertex;
}